

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_safe_arena.h
# Opt level: O3

void __thiscall google::protobuf::internal::ThreadSafeArena::Init(ThreadSafeArena *this)

{
  long lVar1;
  uint64_t uVar2;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  uVar2 = in_FS_OFFSET[-0x10];
  if ((char)uVar2 == '\0') {
    LOCK();
    UNLOCK();
    uVar2 = lifecycle_id_ << 8;
    lifecycle_id_ = lifecycle_id_ + 1;
  }
  in_FS_OFFSET[-0x10] = uVar2 + 1;
  this->tag_and_id_ = uVar2;
  (this->head_)._M_b._M_p = (__pointer_type)kSentryArenaChunk;
  this->first_owner_ = (void *)(lVar1 + -0x80);
  in_FS_OFFSET[-0xe] = (long)&this->first_arena_;
  in_FS_OFFSET[-0xf] = uVar2;
  return;
}

Assistant:

static ThreadCache& thread_cache() { return thread_cache_; }